

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

void __thiscall ON_SHA1::AccumulateFloatArray(ON_SHA1 *this,size_t count,float *a)

{
  float local_3c;
  float *a1;
  float v;
  float x;
  float *a_local;
  size_t count_local;
  ON_SHA1 *this_local;
  
  if ((count != 0) && (a != (float *)0x0)) {
    _v = a;
    a_local = (float *)count;
    count_local = (size_t)this;
    while (_v < a + count) {
      a1._4_4_ = *_v;
      local_3c = a1._4_4_;
      if ((a1._4_4_ == 0.0) && (!NAN(a1._4_4_))) {
        local_3c = 0.0;
      }
      a1._0_4_ = local_3c;
      _v = _v + 1;
      Internal_SwapBigEndianUpdate(this,&a1,4);
    }
  }
  return;
}

Assistant:

void ON_SHA1::AccumulateFloatArray(
  size_t count,
  const float* a
)
{
  if (count > 0 && nullptr != a)
  {
    float x, v;
    const float* a1 = a + count;
    while (a < a1)
    {
      x = *a++;
      v = (0.0f == x ? 0.0f : x);
      Internal_SwapBigEndianUpdate(&v, sizeof(v));
    }
  }
}